

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_hashmap_node * jx9HashmapGetNextEntry(jx9_hashmap *pMap)

{
  jx9_hashmap_node *pCur;
  jx9_hashmap *pMap_local;
  
  pMap_local = (jx9_hashmap *)pMap->pCur;
  if ((jx9_hashmap_node *)pMap_local == (jx9_hashmap_node *)0x0) {
    pMap_local = (jx9_hashmap *)0x0;
  }
  else {
    pMap->pCur = ((jx9_hashmap_node *)pMap_local)->pPrev;
  }
  return (jx9_hashmap_node *)pMap_local;
}

Assistant:

JX9_PRIVATE jx9_hashmap_node * jx9HashmapGetNextEntry(jx9_hashmap *pMap)
{
	jx9_hashmap_node *pCur = pMap->pCur;
	if( pCur == 0 ){
		/* End of the list, return null */
		return 0;
	}
	/* Advance the node cursor */
	pMap->pCur = pCur->pPrev; /* Reverse link */
	return pCur;
}